

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O2

void csrFileTest(string *f1)

{
  size_t sVar1;
  CSR *pCVar2;
  Matrix *this;
  TriangularSolve *this_00;
  long lVar3;
  Matrix *v;
  long lVar4;
  ostream *poVar5;
  Matrix *this_01;
  allocator local_289;
  CSR *local_288;
  CSC *H;
  string local_278;
  string in_path_;
  ifstream fin;
  
  std::__cxx11::string::string((string *)&in_path_,(string *)f1);
  std::ifstream::ifstream(&fin,(string *)&in_path_,_S_in);
  format::read_mtx_csc_real(&fin,&H,true);
  pCVar2 = (CSR *)operator_new(0x30);
  CSR::CSR(pCVar2,(int)H->n,(int)H->m,(int)H->nnz,H->p,H->i,H->x);
  CSR::turntoCSR(pCVar2);
  this = (Matrix *)operator_new(0x30);
  sVar1 = H->n;
  std::__cxx11::string::string((string *)&local_278,"rhcr:",&local_289);
  Matrix::Matrix(this,(int)sVar1,1,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  Matrix::Random(this);
  this_00 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(this_00,(int)H->n);
  lVar3 = std::chrono::_V2::system_clock::now();
  local_288 = pCVar2;
  v = TriangularSolve::solve(this_00,pCVar2,this);
  lVar4 = std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"execution time (CSR Solve):");
  poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
  std::operator<<(poVar5,"\n");
  pCVar2 = local_288;
  this_01 = CSR::csrMult(local_288,v);
  Matrix::isequal(this_01,this);
  format::CSC::~CSC(H);
  operator_delete(H,0x38);
  CSR::~CSR(pCVar2);
  operator_delete(pCVar2,0x30);
  Matrix::~Matrix(this);
  operator_delete(this,0x30);
  TriangularSolve::~TriangularSolve(this_00);
  operator_delete(this_00,4);
  if (v != (Matrix *)0x0) {
    Matrix::~Matrix(v);
  }
  operator_delete(v,0x30);
  Matrix::~Matrix(this_01);
  operator_delete(this_01,0x30);
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&in_path_);
  return;
}

Assistant:

void  csrFileTest(string f1)
{

    //sparse matrix file(csc)
    // std::string in_path_ = "D:\\github\\Axb\\sympiler\\LFAT5.mtx";
    // std::string in_path_ = "D:\\github\\Axb\\sympiler\\bcsstk01.mtx";
    std::string in_path_ = f1;
    std::ifstream fin(in_path_);
    format::CSC *H;
    read_mtx_csc_real(fin, H, true);

    //print of csc file
    CSR *ccf = new CSR(H->n, H->m, H->nnz, H->p, H->i, H->x);
    //ccf->triplet();

    //turn to csr
    // cout<<"CSR:"<<"\n";
    ccf->turntoCSR();
    // ccf->triplet();

    //csc file Solve
    Matrix *rhcr = new Matrix(H->n,1,"rhcr:");
    rhcr->Random();
    // rhcr->print();
    TriangularSolve *rs2 = new TriangularSolve(H->n);
    //time
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    start = std::chrono::system_clock::now();
    Matrix *result2 = rs2->solve( ccf, rhcr);
    end = std::chrono::system_clock::now();
    elapsed_seconds = end - start;
    double durationSym = elapsed_seconds.count();
    cout << "execution time (CSR Solve):" << durationSym << "\n";
    //result2->print();

    //csr Solve,Test the equation(ccf*y=rhcr)
    Matrix *rs3 = ccf->csrMult(result2);
    //  rs3->print();
    bool r2 = rs3->isequal(rhcr);
    // cout<<"the result of Triangular solve is(CSR): "<<r2 <<"\n";

    //multiply of csc(file) and vector(file)
    //Matrix *mf = cf->turnToRegular();
    // mf->print();
    //Matrix *vf = cf->csrMult();
    //  vf->print();

    delete H;
    delete ccf;
    delete rhcr;
    delete rs2;
    delete result2;
    delete rs3;

}